

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ioWriteBlif.c
# Opt level: O1

void Io_NtkWriteNodeIntStruct(FILE *pFile,Abc_Obj_t *pNode,Vec_Int_t *vCover,char *pStr)

{
  uint nInputs;
  word wVar1;
  word *pwVar2;
  int iVar3;
  size_t sVar4;
  int *piVar5;
  char *pcVar6;
  void **ppvVar7;
  char *pcVar8;
  uint uVar9;
  ulong uVar10;
  word (*pawVar11) [1024];
  undefined8 uVar12;
  int iVar13;
  long lVar14;
  int nLutLeaf;
  long lVar15;
  int iVar16;
  ulong uVar17;
  int nLutRoot;
  word Func1;
  word Func0;
  char pLut2 [32];
  word Func2;
  char pLut1 [32];
  char pLut0 [32];
  word pRes [1024];
  word pCube [1024];
  
  nInputs = (pNode->vFanins).nSize;
  sVar4 = strlen(pStr);
  iVar3 = (int)sVar4;
  if (iVar3 - 4U < 0xfffffffe) {
    printf("Wrong LUT struct (%s)\n",pStr);
    return;
  }
  uVar10 = 0;
  do {
    if ((byte)(pStr[uVar10] - 0x37U) < 0xfc) {
      printf("The LUT size (%d) should belong to {3,4,5,6}.\n",(ulong)((int)pStr[uVar10] - 0x30));
      return;
    }
    uVar10 = uVar10 + 1;
  } while ((sVar4 & 0xffffffff) != uVar10);
  iVar16 = 0;
  if (iVar3 == 3) {
    iVar16 = pStr[1] + -0x30;
  }
  iVar13 = iVar16 + -1;
  if (iVar16 == 0) {
    iVar13 = 0;
  }
  if ((int)pStr[iVar3 - 1] + iVar13 + *pStr + -0x61 < (int)nInputs) {
    printf("The node size (%d) is too large for the LUT structure %s.\n",(ulong)nInputs,pStr);
    return;
  }
  nLutLeaf = *pStr + -0x30;
  nLutRoot = pStr[iVar3 - 1] + -0x30;
  fputc(10,(FILE *)pFile);
  iVar13 = nLutRoot;
  if (nLutRoot < nLutLeaf) {
    iVar13 = nLutLeaf;
  }
  if (iVar13 < iVar16) {
    iVar13 = iVar16;
  }
  if ((int)nInputs <= iVar13) {
    fwrite(".names",6,1,(FILE *)pFile);
    if (0 < (pNode->vFanins).nSize) {
      lVar14 = 0;
      do {
        pcVar8 = Abc_ObjName((Abc_Obj_t *)
                             pNode->pNtk->vObjs->pArray[(pNode->vFanins).pArray[lVar14]]);
        fprintf((FILE *)pFile," %s",pcVar8);
        lVar14 = lVar14 + 1;
      } while (lVar14 < (pNode->vFanins).nSize);
    }
    pcVar8 = Abc_ObjName((Abc_Obj_t *)pNode->pNtk->vObjs->pArray[*(pNode->vFanouts).pArray]);
    fprintf((FILE *)pFile," %s\n",pcVar8);
    fputs((char *)(pNode->field_5).pData,(FILE *)pFile);
    return;
  }
  pLut2[0x10] = '\0';
  pLut2[0x11] = '\0';
  pLut2[0x12] = '\0';
  pLut2[0x13] = '\0';
  pLut2[0x14] = '\0';
  pLut2[0x15] = '\0';
  pLut2[0x16] = '\0';
  pLut2[0x17] = '\0';
  pLut2[0x18] = '\0';
  pLut2[0x19] = '\0';
  pLut2[0x1a] = '\0';
  pLut2[0x1b] = '\0';
  pLut2[0x1c] = '\0';
  pLut2[0x1d] = '\0';
  pLut2[0x1e] = '\0';
  pLut2[0x1f] = '\0';
  pLut2[0] = '\0';
  pLut2[1] = '\0';
  pLut2[2] = '\0';
  pLut2[3] = '\0';
  pLut2[4] = '\0';
  pLut2[5] = '\0';
  pLut2[6] = '\0';
  pLut2[7] = '\0';
  pLut2[8] = '\0';
  pLut2[9] = '\0';
  pLut2[10] = '\0';
  pLut2[0xb] = '\0';
  pLut2[0xc] = '\0';
  pLut2[0xd] = '\0';
  pLut2[0xe] = '\0';
  pLut2[0xf] = '\0';
  if (Io_NtkWriteNodeIntStruct::TruthStore[0][0] == 0) {
    pawVar11 = Io_NtkWriteNodeIntStruct::TruthStore;
    lVar14 = 0;
    do {
      *(word (**) [1024])((long)Io_NtkWriteNodeIntStruct::pTruths + lVar14) = pawVar11;
      lVar14 = lVar14 + 8;
      pawVar11 = pawVar11 + 1;
    } while (lVar14 != 0x80);
    lVar14 = 0;
    do {
      wVar1 = Io_NtkWriteNodeIntStruct::Truth6[lVar14];
      pwVar2 = Io_NtkWriteNodeIntStruct::pTruths[lVar14];
      lVar15 = 0;
      do {
        pwVar2[lVar15] = wVar1;
        lVar15 = lVar15 + 1;
      } while (lVar15 != 0x400);
      lVar14 = lVar14 + 1;
    } while (lVar14 != 6);
    lVar14 = 6;
    do {
      pwVar2 = Io_NtkWriteNodeIntStruct::pTruths[lVar14];
      lVar15 = 0;
      do {
        pwVar2[lVar15] = -(ulong)((1 << ((char)lVar14 - 6U & 0x1f) & (uint)lVar15) != 0);
        lVar15 = lVar15 + 1;
      } while (lVar15 != 0x400);
      lVar14 = lVar14 + 1;
    } while (lVar14 != 0x10);
  }
  Abc_SopToTruthBig((char *)(pNode->field_5).pData,nInputs,Io_NtkWriteNodeIntStruct::pTruths,pCube,
                    pRes);
  uVar9 = 1 << ((char)nInputs - 5U & 0x1f);
  if ((int)nInputs < 6) {
    uVar9 = 1;
  }
  uVar17 = (ulong)uVar9;
  uVar10 = uVar17;
  do {
    iVar13 = (int)uVar10;
    if (iVar13 < 1) goto LAB_0031fba1;
    lVar14 = uVar10 * 4;
    uVar10 = uVar10 - 1;
  } while (*(int *)((long)pRes + lVar14 + -4) == 0);
  uVar10 = uVar17;
  if (0 < iVar13) {
    do {
      iVar13 = (int)uVar10;
      if (iVar13 < 1) goto LAB_0031fba1;
      lVar14 = uVar10 * 4;
      uVar10 = uVar10 - 1;
    } while (*(int *)((long)pRes + lVar14 + -4) == -1);
    if (0 < iVar13) {
      if (iVar3 == 2) {
        iVar16 = If_CluCheckExt((void *)0x0,pRes,nInputs,nLutLeaf,nLutRoot,pLut0,pLut1,&Func0,&Func1
                               );
        if (iVar16 != 0) {
LAB_0031fc59:
          fwrite(".names",6,1,(FILE *)pFile);
          if ('\0' < pLut1[0]) {
            lVar14 = 0;
            do {
              pcVar8 = Abc_ObjName((Abc_Obj_t *)
                                   pNode->pNtk->vObjs->pArray
                                   [(pNode->vFanins).pArray[pLut1[lVar14 + 2]]]);
              fprintf((FILE *)pFile," %s",pcVar8);
              lVar14 = lVar14 + 1;
            } while (lVar14 < pLut1[0]);
          }
          pcVar8 = Abc_ObjName((Abc_Obj_t *)pNode->pNtk->vObjs->pArray[*(pNode->vFanouts).pArray]);
          fprintf((FILE *)pFile," %s_lut1\n",pcVar8);
          pcVar8 = Io_NtkDeriveSop((Mem_Flex_t *)pNode->pNtk->pManFunc,Func1,(int)pLut1[0],vCover);
          fputs(pcVar8,(FILE *)pFile);
          if ((iVar3 == 3) && ('\0' < pLut2[0])) {
            fwrite(".names",6,1,(FILE *)pFile);
            if ('\0' < pLut2[0]) {
              lVar14 = 0;
              do {
                if (nInputs == (int)pLut2[lVar14 + 2]) {
                  piVar5 = (pNode->vFanouts).pArray;
                  pcVar8 = " %s_lut1";
                }
                else {
                  piVar5 = (pNode->vFanins).pArray + (int)pLut2[lVar14 + 2];
                  pcVar8 = " %s";
                }
                pcVar6 = Abc_ObjName((Abc_Obj_t *)pNode->pNtk->vObjs->pArray[*piVar5]);
                fprintf((FILE *)pFile,pcVar8,pcVar6);
                lVar14 = lVar14 + 1;
              } while (lVar14 < pLut2[0]);
            }
            pcVar8 = Abc_ObjName((Abc_Obj_t *)pNode->pNtk->vObjs->pArray[*(pNode->vFanouts).pArray])
            ;
            fprintf((FILE *)pFile," %s_lut2\n",pcVar8);
            pcVar8 = Io_NtkDeriveSop((Mem_Flex_t *)pNode->pNtk->pManFunc,Func2,(int)pLut2[0],vCover)
            ;
            fputs(pcVar8,(FILE *)pFile);
          }
          fwrite(".names",6,1,(FILE *)pFile);
          if ('\0' < pLut0[0]) {
            lVar14 = 0;
            do {
              uVar9 = (uint)pLut0[lVar14 + 2];
              if (nInputs == uVar9) {
                piVar5 = (pNode->vFanouts).pArray;
                ppvVar7 = pNode->pNtk->vObjs->pArray;
                pcVar8 = " %s_lut1";
              }
              else {
                ppvVar7 = pNode->pNtk->vObjs->pArray;
                if (nInputs + 1 == uVar9) {
                  piVar5 = (pNode->vFanouts).pArray;
                  pcVar8 = " %s_lut2";
                }
                else {
                  piVar5 = (pNode->vFanins).pArray + (int)uVar9;
                  pcVar8 = " %s";
                }
              }
              pcVar6 = Abc_ObjName((Abc_Obj_t *)ppvVar7[*piVar5]);
              fprintf((FILE *)pFile,pcVar8,pcVar6);
              lVar14 = lVar14 + 1;
            } while (lVar14 < pLut0[0]);
          }
          pcVar8 = Abc_ObjName((Abc_Obj_t *)pNode->pNtk->vObjs->pArray[*(pNode->vFanouts).pArray]);
          fprintf((FILE *)pFile," %s\n",pcVar8);
          pcVar8 = Io_NtkDeriveSop((Mem_Flex_t *)pNode->pNtk->pManFunc,Func0,(int)pLut0[0],vCover);
          fputs(pcVar8,(FILE *)pFile);
          return;
        }
        Extra_PrintHex(_stdout,(uint *)pRes,nInputs);
        printf("    ");
      }
      else {
        iVar16 = If_CluCheckExt3((void *)0x0,pRes,nInputs,nLutLeaf,iVar16,nLutRoot,pLut0,pLut1,pLut2
                                 ,&Func0,&Func1,&Func2);
        if (iVar16 != 0) goto LAB_0031fc59;
        Extra_PrintHex(_stdout,(uint *)pRes,nInputs);
        printf("    ");
      }
      Kit_DsdPrintFromTruth((uint *)pRes,nInputs);
      putchar(10);
      pcVar8 = Abc_ObjName((Abc_Obj_t *)pNode->pNtk->vObjs->pArray[*(pNode->vFanouts).pArray]);
      printf("Node \"%s\" is not decomposable. Writing BLIF has failed.\n",pcVar8);
      return;
    }
  }
LAB_0031fba1:
  pcVar8 = Abc_ObjName((Abc_Obj_t *)pNode->pNtk->vObjs->pArray[*(pNode->vFanouts).pArray]);
  do {
    if ((int)uVar17 < 1) {
      uVar12 = 1;
      goto LAB_0031fbde;
    }
    lVar14 = uVar17 * 4;
    uVar17 = uVar17 - 1;
  } while (*(int *)((long)pRes + lVar14 + -4) == -1);
  uVar12 = 0;
LAB_0031fbde:
  fprintf((FILE *)pFile,".names %s\n %d\n",pcVar8,uVar12);
  return;
}

Assistant:

void Io_NtkWriteNodeIntStruct( FILE * pFile, Abc_Obj_t * pNode, Vec_Int_t * vCover, char * pStr )
{
    Abc_Obj_t * pNet;
    int nLeaves = Abc_ObjFaninNum(pNode);
    int i, nLutLeaf, nLutLeaf2, nLutRoot, Length;

    // quit if parameters are wrong
    Length = strlen(pStr);
    if ( Length != 2 && Length != 3 )
    {
        printf( "Wrong LUT struct (%s)\n", pStr );
        return;
    }
    for ( i = 0; i < Length; i++ )
        if ( pStr[i] - '0' < 3 || pStr[i] - '0' > 6 )
        {
            printf( "The LUT size (%d) should belong to {3,4,5,6}.\n", pStr[i] - '0' );
            return;
        }

    nLutLeaf  =                   pStr[0] - '0';
    nLutLeaf2 = ( Length == 3 ) ? pStr[1] - '0' : 0;
    nLutRoot  =                   pStr[Length-1] - '0';
    if ( nLeaves > nLutLeaf - 1 + (nLutLeaf2 ? nLutLeaf2 - 1 : 0) + nLutRoot )
    {
        printf( "The node size (%d) is too large for the LUT structure %s.\n", nLeaves, pStr );
        return;
    }

    // consider easy case
    fprintf( pFile, "\n" );
    if ( nLeaves <= Abc_MaxInt( nLutLeaf2, Abc_MaxInt(nLutLeaf, nLutRoot) ) )
    {
        // write the .names line
        fprintf( pFile, ".names" );
        Abc_ObjForEachFanin( pNode, pNet, i )
            fprintf( pFile, " %s", Abc_ObjName(pNet) );
        // get the output name
        fprintf( pFile, " %s\n", Abc_ObjName(Abc_ObjFanout0(pNode)) );
        // write the cubes
        fprintf( pFile, "%s", (char*)Abc_ObjData(pNode) );
        return;
    }
    else
    {
        extern int If_CluMinimumBase( word * t, int * pSupp, int nVarsAll, int * pnVars );

        static word TruthStore[16][1<<10] = {{0}}, * pTruths[16];
        word pCube[1<<10], pRes[1<<10], Func0, Func1, Func2;
        char pLut0[32], pLut1[32], pLut2[32] = {0}, * pSop;
//        int nVarsMin[3], pVars[3][20];

        if ( TruthStore[0][0] == 0 )
        {
            static word Truth6[6] = {
                ABC_CONST(0xAAAAAAAAAAAAAAAA),
                ABC_CONST(0xCCCCCCCCCCCCCCCC),
                ABC_CONST(0xF0F0F0F0F0F0F0F0),
                ABC_CONST(0xFF00FF00FF00FF00),
                ABC_CONST(0xFFFF0000FFFF0000),
                ABC_CONST(0xFFFFFFFF00000000)
            };
            int nVarsMax = 16;
            int nWordsMax = (1 << 10);
            int i, k;
            assert( nVarsMax <= 16 );
            for ( i = 0; i < nVarsMax; i++ )
                pTruths[i] = TruthStore[i];
            for ( i = 0; i < 6; i++ )
                for ( k = 0; k < nWordsMax; k++ )
                    pTruths[i][k] = Truth6[i];
            for ( i = 6; i < nVarsMax; i++ )
                for ( k = 0; k < nWordsMax; k++ )
                    pTruths[i][k] = ((k >> (i-6)) & 1) ? ~(word)0 : 0;
        }

        // collect variables
//        Abc_ObjForEachFanin( pNode, pNet, i )
//            pVars[0][i] = pVars[1][i] = pVars[2][i] = i;

        // derive truth table
        Abc_SopToTruthBig( (char*)Abc_ObjData(pNode), nLeaves, pTruths, pCube, pRes );
        if ( Kit_TruthIsConst0((unsigned *)pRes, nLeaves) || Kit_TruthIsConst1((unsigned *)pRes, nLeaves) )
        {
            fprintf( pFile, ".names %s\n %d\n", Abc_ObjName(Abc_ObjFanout0(pNode)), Kit_TruthIsConst1((unsigned *)pRes, nLeaves) );
            return;
        }

//        Extra_PrintHex( stdout, (unsigned *)pRes, nLeaves );  printf( "    " );
//        Kit_DsdPrintFromTruth( (unsigned*)pRes, nLeaves );  printf( "\n" );

        // perform decomposition
        if ( Length == 2 )
        {
            if ( !If_CluCheckExt( NULL, pRes, nLeaves, nLutLeaf, nLutRoot, pLut0, pLut1, &Func0, &Func1 ) )
            {
                Extra_PrintHex( stdout, (unsigned *)pRes, nLeaves );  printf( "    " );
                Kit_DsdPrintFromTruth( (unsigned*)pRes, nLeaves );  printf( "\n" );
                printf( "Node \"%s\" is not decomposable. Writing BLIF has failed.\n", Abc_ObjName(Abc_ObjFanout0(pNode)) );
                return;
            }
        }
        else
        {
            if ( !If_CluCheckExt3( NULL, pRes, nLeaves, nLutLeaf, nLutLeaf2, nLutRoot, pLut0, pLut1, pLut2, &Func0, &Func1, &Func2 ) )
            {
                Extra_PrintHex( stdout, (unsigned *)pRes, nLeaves );  printf( "    " );
                Kit_DsdPrintFromTruth( (unsigned*)pRes, nLeaves );  printf( "\n" );
                printf( "Node \"%s\" is not decomposable. Writing BLIF has failed.\n", Abc_ObjName(Abc_ObjFanout0(pNode)) );
                return;
            }
        }

        // write leaf node
        fprintf( pFile, ".names" );
        for ( i = 0; i < pLut1[0]; i++ )
            fprintf( pFile, " %s", Abc_ObjName(Abc_ObjFanin(pNode,pLut1[2+i])) );
        fprintf( pFile, " %s_lut1\n", Abc_ObjName(Abc_ObjFanout0(pNode)) );
        // write SOP
        pSop = Io_NtkDeriveSop( (Mem_Flex_t *)Abc_ObjNtk(pNode)->pManFunc, Func1, pLut1[0], vCover );
        fprintf( pFile, "%s", pSop );

        if ( Length == 3 && pLut2[0] > 0 )
        {
            // write leaf node
            fprintf( pFile, ".names" );
            for ( i = 0; i < pLut2[0]; i++ )
                if ( pLut2[2+i] == nLeaves )
                    fprintf( pFile, " %s_lut1", Abc_ObjName(Abc_ObjFanout0(pNode)) );
                else
                    fprintf( pFile, " %s", Abc_ObjName(Abc_ObjFanin(pNode,pLut2[2+i])) );
            fprintf( pFile, " %s_lut2\n", Abc_ObjName(Abc_ObjFanout0(pNode)) );
            // write SOP
            pSop = Io_NtkDeriveSop( (Mem_Flex_t *)Abc_ObjNtk(pNode)->pManFunc, Func2, pLut2[0], vCover );
            fprintf( pFile, "%s", pSop );
        }

        // write root node
        fprintf( pFile, ".names" );
        for ( i = 0; i < pLut0[0]; i++ )
            if ( pLut0[2+i] == nLeaves )
                fprintf( pFile, " %s_lut1", Abc_ObjName(Abc_ObjFanout0(pNode)) );
            else if ( pLut0[2+i] == nLeaves+1 )
                fprintf( pFile, " %s_lut2", Abc_ObjName(Abc_ObjFanout0(pNode)) );
            else
                fprintf( pFile, " %s", Abc_ObjName(Abc_ObjFanin(pNode,pLut0[2+i])) );
        fprintf( pFile, " %s\n", Abc_ObjName(Abc_ObjFanout0(pNode)) );
        // write SOP
        pSop = Io_NtkDeriveSop( (Mem_Flex_t *)Abc_ObjNtk(pNode)->pManFunc, Func0, pLut0[0], vCover );
        fprintf( pFile, "%s", pSop );
    }
}